

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitview.h
# Opt level: O2

void __thiscall
bv::internal::bitview<std::vector>::set
          (bitview<std::vector> *this,size_t begin,size_t end,word_type value)

{
  unsigned_long value_00;
  ulong begin_00;
  ulong begin_01;
  ulong uVar1;
  ulong end_00;
  
  end_00 = end - begin;
  if (begin <= end && end_00 != 0) {
    begin_00 = (ulong)((uint)begin & 0x3f);
    uVar1 = 0x40 - begin_00;
    begin_01 = uVar1;
    if (end_00 < uVar1) {
      begin_01 = end_00;
    }
    set_bitfield<unsigned_long>
              ((this->_container).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start + (begin >> 6),begin_00,begin_01 + begin_00,
               value);
    if (uVar1 < end_00) {
      value_00 = bitfield<unsigned_long,void>(value,begin_01,end_00);
      set_bitfield<unsigned_long>
                ((this->_container).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start + (begin >> 6) + 1,0,end_00 - begin_01,value_00);
      return;
    }
  }
  return;
}

Assistant:

void bitview<Container>::set(size_t begin, size_t end, word_type value)
        {
            if(is_empty_range(begin, end))
                return;
            
            size_t len = end - begin;
            
            assert(len <= W);
            check_valid_range(begin, end, size());
            ensure_bitsize(value, len);
            
            range_location_t loc = locate(begin, end);
            
            set_bitfield(_container[loc.index],
                         loc.lbegin, loc.lbegin + loc.llen, value);
            
            if(loc.hlen != 0) {
                word_type bits = bitfield(value, loc.llen, loc.llen + loc.hlen);
                set_bitfield(_container[loc.index + 1], 0, loc.hlen, bits);
            }
        }